

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O2

bool double_conversion::Advance<char_const*>(char **it,uc16 separator,int base,char **end)

{
  bool bVar1;
  char *pcVar2;
  int iVar3;
  undefined6 in_register_00000032;
  char *pcVar4;
  char *pcVar5;
  
  pcVar4 = *it;
  iVar3 = (int)CONCAT62(in_register_00000032,separator);
  if (iVar3 == 0) {
    *it = pcVar4 + 1;
    bVar1 = pcVar4 + 1 == *end;
  }
  else {
    bVar1 = isDigit((int)*pcVar4,base);
    pcVar2 = pcVar4 + 1;
    *it = pcVar2;
    pcVar5 = *end;
    if ((~bVar1 & 1U) != 0 || pcVar2 == pcVar5) {
      bVar1 = bVar1 || pcVar2 == pcVar5;
    }
    else {
      pcVar4 = pcVar4 + 2;
      if (pcVar4 == pcVar5) {
        bVar1 = false;
      }
      else {
        if ((*pcVar2 == iVar3) && (bVar1 = isDigit((int)*pcVar4,base), bVar1)) {
          *it = pcVar4;
          pcVar5 = *end;
          pcVar2 = pcVar4;
        }
        bVar1 = pcVar2 == pcVar5;
      }
    }
  }
  return bVar1;
}

Assistant:

static bool Advance (Iterator* it, uc16 separator, int base, Iterator& end) {
  if (separator == StringToDoubleConverter::kNoSeparator) {
    ++(*it);
    return *it == end;
  }
  if (!isDigit(**it, base)) {
    ++(*it);
    return *it == end;
  }
  ++(*it);
  if (*it == end) return true;
  if (*it + 1 == end) return false;
  if (**it == separator && isDigit(*(*it + 1), base)) {
    ++(*it);
  }
  return *it == end;
}